

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.h
# Opt level: O1

void __thiscall
Eigen::DenseBase<Eigen::Matrix<float,35,1,0,35,1>>::
visit<Eigen::internal::max_coeff_visitor<Eigen::Matrix<float,35,1,0,35,1>>>
          (DenseBase<Eigen::Matrix<float,35,1,0,35,1>> *this,
          max_coeff_visitor<Eigen::Matrix<float,_35,_1,_0,_35,_1>_> *visitor)

{
  Scalar *pSVar1;
  float fVar2;
  ThisEvaluator thisEval;
  visitor_evaluator<Eigen::Matrix<float,_35,_1,_0,_35,_1>_> local_28;
  
  local_28.m_evaluator.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>_>.m_data =
       (Scalar *)this;
  local_28.m_xpr = (Matrix<float,_35,_1,_0,_35,_1> *)this;
  internal::
  visitor_impl<Eigen::internal::max_coeff_visitor<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>,_Eigen::internal::visitor_evaluator<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>,_31>
  ::run(&local_28,visitor);
  fVar2 = *(float *)((long)local_28.m_evaluator.
                           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>_>
                           .m_data + 0x7c);
  pSVar1 = &(visitor->super_coeff_visitor<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).res;
  if (*pSVar1 <= fVar2 && fVar2 != *pSVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).res = fVar2;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).row = 0x1f;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).col = 0;
  }
  fVar2 = *(float *)((long)local_28.m_evaluator.
                           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>_>
                           .m_data + 0x80);
  pSVar1 = &(visitor->super_coeff_visitor<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).res;
  if (*pSVar1 <= fVar2 && fVar2 != *pSVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).res = fVar2;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).row = 0x20;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).col = 0;
  }
  fVar2 = *(float *)((long)local_28.m_evaluator.
                           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>_>
                           .m_data + 0x84);
  pSVar1 = &(visitor->super_coeff_visitor<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).res;
  if (*pSVar1 <= fVar2 && fVar2 != *pSVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).res = fVar2;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).row = 0x21;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).col = 0;
  }
  fVar2 = *(float *)((long)local_28.m_evaluator.
                           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>_>
                           .m_data + 0x88);
  pSVar1 = &(visitor->super_coeff_visitor<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).res;
  if (*pSVar1 <= fVar2 && fVar2 != *pSVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).res = fVar2;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).row = 0x22;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).col = 0;
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
void DenseBase<Derived>::visit(Visitor& visitor) const
{
  typedef typename internal::visitor_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());
  
  enum {
    unroll =  SizeAtCompileTime != Dynamic
           && SizeAtCompileTime * ThisEvaluator::CoeffReadCost + (SizeAtCompileTime-1) * internal::functor_traits<Visitor>::Cost <= EIGEN_UNROLLING_LIMIT
  };
  return internal::visitor_impl<Visitor, ThisEvaluator, unroll ? int(SizeAtCompileTime) : Dynamic>::run(thisEval, visitor);
}